

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV64S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  char *pcVar2;
  long *plVar3;
  ushort *puVar4;
  uint *puVar5;
  ulong hasbits_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if ((long)ptr[2] < 0) {
    pcVar2 = SingularVarBigint<unsigned_long,unsigned_short,false>
                       (msg,ptr + 2,ctx,data,table,hasbits_00);
    return pcVar2;
  }
  plVar3 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar3 & 7) != 0) {
    AlignFail(plVar3);
  }
  puVar4 = (ushort *)(ptr + 3);
  *plVar3 = (long)ptr[2];
  if (puVar4 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar1 = (uint)table->fast_idx_mask & (uint)*puVar4;
    if ((uVar1 & 7) == 0) {
      pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
      return pcVar2;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar5 & 3) != 0) {
      AlignFail();
    }
    *puVar5 = *puVar5 | (uint)hasbits_00;
  }
  return (char *)puVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}